

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O0

time_t xstrpisotime(char *s,char **endptr)

{
  char cVar1;
  void *pvVar2;
  char **ppcVar3;
  bool bVar4;
  time_t local_58;
  time_t res;
  tm_conflict tm;
  char **endptr_local;
  char *s_local;
  
  local_58 = -1;
  tm.tm_zone = (char *)endptr;
  endptr_local = (char **)s;
  memset(&res,0,0x38);
  while( true ) {
    bVar4 = true;
    if (*(char *)endptr_local != ' ') {
      bVar4 = *(char *)endptr_local == '\t';
    }
    if (!bVar4) break;
    endptr_local = (char **)((long)endptr_local + 1);
  }
  tm.tm_mday = strtoi_lim((char *)endptr_local,(char **)&endptr_local,0x62f,0xfff);
  if (((((-1 < tm.tm_mday) &&
        (ppcVar3 = (char **)((long)endptr_local + 1), cVar1 = *(char *)endptr_local,
        endptr_local = ppcVar3, cVar1 == '-')) &&
       (tm.tm_hour = strtoi_lim((char *)ppcVar3,(char **)&endptr_local,1,0xc), -1 < tm.tm_hour)) &&
      ((((ppcVar3 = (char **)((long)endptr_local + 1), cVar1 = *(char *)endptr_local,
         endptr_local = ppcVar3, cVar1 == '-' &&
         (tm.tm_min = strtoi_lim((char *)ppcVar3,(char **)&endptr_local,1,0x1f), -1 < tm.tm_min)) &&
        ((ppcVar3 = (char **)((long)endptr_local + 1), cVar1 = *(char *)endptr_local,
         endptr_local = ppcVar3, cVar1 == 'T' &&
         ((tm.tm_sec = strtoi_lim((char *)ppcVar3,(char **)&endptr_local,0,0x17), -1 < tm.tm_sec &&
          (ppcVar3 = (char **)((long)endptr_local + 1), cVar1 = *(char *)endptr_local,
          endptr_local = ppcVar3, cVar1 == ':')))))) &&
       (res._4_4_ = strtoi_lim((char *)ppcVar3,(char **)&endptr_local,0,0x3b), -1 < res._4_4_)))) &&
     (((ppcVar3 = (char **)((long)endptr_local + 1), cVar1 = *(char *)endptr_local,
       endptr_local = ppcVar3, cVar1 == ':' &&
       (res._0_4_ = strtoi_lim((char *)ppcVar3,(char **)&endptr_local,0,0x3c), -1 < (int)res)) &&
      (ppcVar3 = (char **)((long)endptr_local + 1), cVar1 = *(char *)endptr_local,
      endptr_local = ppcVar3, cVar1 == 'Z')))) {
    tm.tm_mday = tm.tm_mday + -0x76c;
    tm.tm_hour = tm.tm_hour + -1;
    local_58 = time_from_tm((tm_conflict *)&res);
  }
  if (tm.tm_zone != (char *)0x0) {
    pvVar2 = deconst(endptr_local);
    *(void **)tm.tm_zone = pvVar2;
  }
  return local_58;
}

Assistant:

static time_t
xstrpisotime(const char *s, char **endptr)
{
/** like strptime() but strictly for ISO 8601 Zulu strings */
	struct tm tm;
	time_t res = (time_t)-1;

	/* make sure tm is clean */
	memset(&tm, 0, sizeof(tm));

	/* as a courtesy to our callers, and since this is a non-standard
	 * routine, we skip leading whitespace */
	while (*s == ' ' || *s == '\t')
		++s;

	/* read year */
	if ((tm.tm_year = strtoi_lim(s, &s, 1583, 4095)) < 0 || *s++ != '-') {
		goto out;
	}
	/* read month */
	if ((tm.tm_mon = strtoi_lim(s, &s, 1, 12)) < 0 || *s++ != '-') {
		goto out;
	}
	/* read day-of-month */
	if ((tm.tm_mday = strtoi_lim(s, &s, 1, 31)) < 0 || *s++ != 'T') {
		goto out;
	}
	/* read hour */
	if ((tm.tm_hour = strtoi_lim(s, &s, 0, 23)) < 0 || *s++ != ':') {
		goto out;
	}
	/* read minute */
	if ((tm.tm_min = strtoi_lim(s, &s, 0, 59)) < 0 || *s++ != ':') {
		goto out;
	}
	/* read second */
	if ((tm.tm_sec = strtoi_lim(s, &s, 0, 60)) < 0 || *s++ != 'Z') {
		goto out;
	}

	/* massage TM to fulfill some of POSIX' constraints */
	tm.tm_year -= 1900;
	tm.tm_mon--;

	/* now convert our custom tm struct to a unix stamp using UTC */
	res = time_from_tm(&tm);

out:
	if (endptr != NULL) {
		*endptr = deconst(s);
	}
	return res;
}